

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O0

void write64_le(uint64_t v,uint8_t *buf)

{
  uint8_t *buf_local;
  uint64_t v_local;
  
  *buf = (uint8_t)v;
  buf[1] = (uint8_t)(v >> 8);
  buf[2] = (uint8_t)(v >> 0x10);
  buf[3] = (uint8_t)(v >> 0x18);
  buf[4] = (uint8_t)(v >> 0x20);
  buf[5] = (uint8_t)(v >> 0x28);
  buf[6] = (uint8_t)(v >> 0x30);
  buf[7] = (uint8_t)(v >> 0x38);
  return;
}

Assistant:

static inline void write64_le(uint64_t v, uint8_t buf[8])
{
  *buf++ = v & 0xff;
  *buf++ = (v >> 8) & 0xff;
  *buf++ = (v >> 16) & 0xff;
  *buf++ = (v >> 24) & 0xff;
  *buf++ = (v >> 32) & 0xff;
  *buf++ = (v >> 40) & 0xff;
  *buf++ = (v >> 48) & 0xff;
  *buf   = (v >> 56) & 0xff;
}